

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *
anon_unknown.dwarf_23886::gen3
          (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *__return_storage_ptr__,int *Budget
          ,int Width)

{
  initializer_list<llvm::Value_*> __l;
  initializer_list<llvm::Value_*> __l_00;
  initializer_list<llvm::Value_*> __l_01;
  initializer_list<llvm::Value_*> __l_02;
  initializer_list<llvm::Value_*> __l_03;
  initializer_list<llvm::Value_*> __l_04;
  int *Budget_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte local_182;
  byte local_181;
  allocator<llvm::Value_*> local_161;
  Value *local_160;
  Value *local_158;
  Value *local_150;
  iterator local_148;
  size_type local_140;
  allocator<llvm::Value_*> local_131;
  Value *local_130;
  Value *local_128;
  Value *local_120;
  iterator local_118;
  size_type local_110;
  allocator<llvm::Value_*> local_101;
  Value *local_100;
  Value *local_f8;
  Value *local_f0;
  iterator local_e8;
  size_type local_e0;
  allocator<llvm::Value_*> local_d1;
  Value *local_d0;
  Value *local_c8;
  Value *local_c0;
  iterator local_b8;
  size_type local_b0;
  allocator<llvm::Value_*> local_a1;
  Value *local_a0;
  Value *local_98;
  Value *local_90;
  iterator local_88;
  size_type local_80;
  allocator<llvm::Value_*> local_61;
  Value *local_60;
  Value *local_58;
  Value *local_50;
  iterator local_48;
  size_type local_40;
  Value *local_38;
  Value *C;
  Value *B;
  Value *A;
  int *piStack_18;
  int Width_local;
  int *Budget_local;
  
  A._4_4_ = Width;
  piStack_18 = Budget;
  Budget_local = (int *)__return_storage_ptr__;
  B = genVal(Budget,Width,true,true);
  C = genVal(piStack_18,A._4_4_,true,true);
  Budget_00 = piStack_18;
  iVar2 = A._4_4_;
  bVar1 = llvm::isa<llvm::Constant,llvm::Value*>(&B);
  if (!bVar1) {
    bVar1 = llvm::isa<llvm::UndefValue,llvm::Value*>(&B);
    local_181 = 1;
    if (!bVar1) goto LAB_00285fa5;
  }
  bVar1 = llvm::isa<llvm::Constant,llvm::Value*>(&C);
  local_182 = 0;
  if (!bVar1) {
    bVar1 = llvm::isa<llvm::UndefValue,llvm::Value*>(&C);
    local_182 = bVar1 ^ 0xff;
  }
  local_181 = local_182;
LAB_00285fa5:
  local_38 = genVal(Budget_00,iVar2,(bool)(local_181 & 1),true);
  iVar2 = rand();
  uVar3 = iVar2 % 6;
  switch(uVar3) {
  case 0:
    local_60 = B;
    local_58 = C;
    local_50 = local_38;
    local_48 = &local_60;
    local_40 = 3;
    std::allocator<llvm::Value_*>::allocator(&local_61);
    __l_04._M_len = local_40;
    __l_04._M_array = local_48;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              (__return_storage_ptr__,__l_04,&local_61);
    std::allocator<llvm::Value_*>::~allocator(&local_61);
    break;
  case 1:
    local_a0 = B;
    local_98 = local_38;
    local_90 = C;
    local_88 = &local_a0;
    local_80 = 3;
    std::allocator<llvm::Value_*>::allocator(&local_a1);
    __l_03._M_len = local_80;
    __l_03._M_array = local_88;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              (__return_storage_ptr__,__l_03,&local_a1);
    std::allocator<llvm::Value_*>::~allocator(&local_a1);
    break;
  case 2:
    local_d0 = C;
    local_c8 = B;
    local_c0 = local_38;
    local_b8 = &local_d0;
    local_b0 = 3;
    std::allocator<llvm::Value_*>::allocator(&local_d1);
    __l_02._M_len = local_b0;
    __l_02._M_array = local_b8;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              (__return_storage_ptr__,__l_02,&local_d1);
    std::allocator<llvm::Value_*>::~allocator(&local_d1);
    break;
  case 3:
    local_100 = C;
    local_f8 = local_38;
    local_f0 = B;
    local_e8 = &local_100;
    local_e0 = 3;
    std::allocator<llvm::Value_*>::allocator(&local_101);
    __l_01._M_len = local_e0;
    __l_01._M_array = local_e8;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              (__return_storage_ptr__,__l_01,&local_101);
    std::allocator<llvm::Value_*>::~allocator(&local_101);
    break;
  case 4:
    local_130 = local_38;
    local_128 = B;
    local_120 = C;
    local_118 = &local_130;
    local_110 = 3;
    std::allocator<llvm::Value_*>::allocator(&local_131);
    __l_00._M_len = local_110;
    __l_00._M_array = local_118;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              (__return_storage_ptr__,__l_00,&local_131);
    std::allocator<llvm::Value_*>::~allocator(&local_131);
    break;
  case 5:
    local_160 = local_38;
    local_158 = C;
    local_150 = B;
    local_148 = &local_160;
    local_140 = 3;
    std::allocator<llvm::Value_*>::allocator(&local_161);
    __l._M_len = local_140;
    __l._M_array = local_148;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              (__return_storage_ptr__,__l,&local_161);
    std::allocator<llvm::Value_*>::~allocator(&local_161);
    break;
  default:
    die("false failed at line __LINE__");
    llvm::llvm_unreachable_internal
              ((llvm *)"assert",
               "/workspace/llm4binary/github/license_c_cmakelists/regehr[P]opt-fuzz/opt-fuzz.cpp",
               (char *)0x13a,uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Value *> gen3(int &Budget, int Width) {
  auto A = genVal(Budget, Width, true);
  auto B = genVal(Budget, Width, true);
  auto C = genVal(Budget, Width,
                  (!isa<Constant>(A) && !isa<UndefValue>(A)) ||
                      (!isa<Constant>(B) && !isa<UndefValue>(B)));
  switch (rand() % 6) {
  case 0:
    return std::vector{A, B, C};
  case 1:
    return std::vector{A, C, B};
  case 2:
    return std::vector{B, A, C};
  case 3:
    return std::vector{B, C, A};
  case 4:
    return std::vector{C, A, B};
  case 5:
    return std::vector{C, B, A};
  }
  assert(false);
}